

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyEquivalenceInfo
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,
          PropertyEquivalenceInfo *info)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  int iVar4;
  undefined4 *puVar5;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  local_30 = propertyRecord;
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord_local);
  if ((bVar2) &&
     (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x800) == 0)) {
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<int> *)propertyRecord_local);
    if (iVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xeb,
                                  "(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot)"
                                  ,"We don\'t support equivalent object type spec on accessors.");
      if (!bVar2) goto LAB_00c26f86;
      *puVar5 = 0;
    }
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<int> *)propertyRecord_local);
    if (0xfffe < iVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xec,
                                  "(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax)"
                                  ,
                                  "We don\'t support equivalent object type spec on big property indexes."
                                 );
      if (!bVar2) {
LAB_00c26f86:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<int> *)propertyRecord_local);
    PVar3 = 0xffff;
    if (iVar4 < 0xffff) {
      PVar3 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                        (&this->super_DynamicTypeHandler,(PropertyIndex)iVar4);
    }
    info->slotIndex = PVar3;
    info->isAuxSlot = (int)(uint)(this->super_DynamicTypeHandler).inlineSlotCapacity <= iVar4;
    info->isWritable =
         (bool)(*(byte *)((long)&(propertyRecord_local->super_FinalizableObject).
                                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1) >> 2
               & 1);
    bVar2 = PVar3 != 0xffff;
  }
  else {
    info->slotIndex = 0xffff;
    info->isAuxSlot = false;
    info->isWritable = false;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot, "We don't support equivalent object type spec on accessors.");
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax, "We don't support equivalent object type spec on big property indexes.");
            T propertyIndex = descriptor->template GetDataPropertyIndex<false>();
            info.slotIndex = propertyIndex <= Constants::PropertyIndexMax ?
                AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(propertyIndex)) : Constants::NoSlot;
            info.isAuxSlot = propertyIndex >= GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }